

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsPeriodic(ON_NurbsSurface *this,int dir)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  double *pdVar10;
  double *pointB;
  double *pointA;
  
  if (1 < (uint)dir) {
    return false;
  }
  bVar2 = ON_IsKnotVectorPeriodic
                    (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir]);
  if (bVar2) {
    iVar6 = this->m_cv_count[1U - dir];
    bVar2 = true;
    if (0 < iVar6) {
      iVar9 = this->m_cv_count[(uint)dir] + -1;
      uVar5 = this->m_order[(uint)dir] - 2;
      iVar4 = 0;
      do {
        pdVar10 = (double *)0x0;
        iVar7 = this->m_cv_stride[0];
        iVar3 = this->m_cv_stride[1];
        pdVar1 = this->m_cv;
        if (dir == 0) {
          iVar3 = iVar3 * iVar4;
          uVar8 = iVar7 * uVar5 + iVar3;
          pointA = pdVar1 + uVar8;
          if ((int)uVar8 < 0) {
            pointA = pdVar10;
          }
          if (pdVar1 == (double *)0x0) {
            pointA = pdVar1;
          }
          iVar7 = iVar7 * iVar9;
        }
        else {
          iVar7 = iVar7 * iVar4;
          uVar8 = iVar3 * uVar5 + iVar7;
          pointA = pdVar1 + uVar8;
          if ((int)uVar8 < 0) {
            pointA = pdVar10;
          }
          if (pdVar1 == (double *)0x0) {
            pointA = pdVar1;
          }
          iVar3 = iVar3 * iVar9;
        }
        if (-1 < (int)uVar5) {
          pointB = pdVar1 + (uint)(iVar3 + iVar7);
          if (iVar3 + iVar7 < 0) {
            pointB = pdVar10;
          }
          if (pdVar1 == (double *)0x0) {
            pointB = (double *)0x0;
          }
          iVar9 = iVar9 + ~uVar5;
          iVar6 = uVar5 + 1;
          do {
            bVar2 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pointB);
            if (!bVar2) goto LAB_00545a38;
            pointA = pointA + -(long)this->m_cv_stride[(uint)dir];
            pointB = pointB + -(long)this->m_cv_stride[(uint)dir];
            iVar6 = iVar6 + -1;
          } while (0 < iVar6);
          iVar6 = this->m_cv_count[1U - dir];
          uVar5 = 0xffffffff;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < iVar6);
      bVar2 = true;
    }
  }
  else {
LAB_00545a38:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool 
ON_NurbsSurface::IsPeriodic( int dir ) const
{
  bool bIsPeriodic = false;
  if ( dir >= 0 && dir <= 1 )
  {
    int k;
    bIsPeriodic = ON_IsKnotVectorPeriodic( m_order[dir], m_cv_count[dir], m_knot[dir] );
    if ( bIsPeriodic ) 
    {
      const double *cv0, *cv1;
      int i0 = m_order[dir]-2;
      int i1 = m_cv_count[dir]-1;
      for ( k = 0; k < m_cv_count[1-dir]; k++ )
      {
        cv0 = (dir)?CV(k,i0):CV(i0,k);
        cv1 = (dir)?CV(k,i1):CV(i1,k);
        for ( /*empty*/; i0 >= 0; i0--, i1-- ) 
        {
          if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
            return false;
          cv0 -= m_cv_stride[dir];
          cv1 -= m_cv_stride[dir];      
        }
      }
    }
  }
  return bIsPeriodic;
}